

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

Time __thiscall
helics::TimeCoordinator::updateTimeBlocks(TimeCoordinator *this,int32_t blockId,Time newTime)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  int32_t local_14;
  TimeRepresentation<count_time<9,_long>_> local_10;
  
  ppVar4 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)ppVar1 - (long)ppVar4 >> 6;
  ppVar3 = ppVar4;
  if (0 < lVar5) {
    ppVar3 = (pointer)((long)&(ppVar4->first).internalTimeCode +
                      ((long)ppVar1 - (long)ppVar4 & 0xffffffffffffffc0U));
    lVar5 = lVar5 + 1;
    ppVar4 = ppVar4 + 2;
    do {
      if (ppVar4[-2].second == blockId) {
        ppVar4 = ppVar4 + -2;
        goto LAB_00312965;
      }
      if (ppVar4[-1].second == blockId) {
        ppVar4 = ppVar4 + -1;
        goto LAB_00312965;
      }
      if (ppVar4->second == blockId) goto LAB_00312965;
      if (ppVar4[1].second == blockId) {
        ppVar4 = ppVar4 + 1;
        goto LAB_00312965;
      }
      lVar5 = lVar5 + -1;
      ppVar4 = ppVar4 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)ppVar1 - (long)ppVar3 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppVar4 = ppVar1;
      if ((lVar5 != 3) || (ppVar4 = ppVar3, ppVar3->second == blockId)) goto LAB_00312965;
      ppVar3 = ppVar3 + 1;
    }
    ppVar4 = ppVar3;
    if (ppVar3->second == blockId) goto LAB_00312965;
    ppVar3 = ppVar3 + 1;
  }
  ppVar4 = ppVar3;
  if (ppVar3->second != blockId) {
    ppVar4 = ppVar1;
  }
LAB_00312965:
  if (ppVar4 == ppVar1) {
    local_14 = blockId;
    local_10.internalTimeCode = newTime.internalTimeCode;
    std::
    vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
    ::emplace_back<TimeRepresentation<count_time<9,long>>&,int&>
              ((vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
                *)&this->timeBlocks,&local_10,&local_14);
  }
  else {
    (ppVar4->first).internalTimeCode = newTime.internalTimeCode;
  }
  ppVar4 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->timeBlocks).
           super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = ppVar4 + 1;
  if (ppVar3 != ppVar1 && ppVar4 != ppVar1) {
    do {
      ppVar2 = ppVar3;
      if ((ppVar4->first).internalTimeCode <= (ppVar3->first).internalTimeCode) {
        ppVar2 = ppVar4;
      }
      ppVar4 = ppVar2;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  return (Time)(ppVar4->first).internalTimeCode;
}

Assistant:

Time TimeCoordinator::updateTimeBlocks(int32_t blockId, Time newTime)
{
    auto blk = std::find_if(timeBlocks.begin(), timeBlocks.end(), [blockId](const auto& block) {
        return (block.second == blockId);
    });
    if (blk != timeBlocks.end()) {
        blk->first = newTime;
    } else {
        timeBlocks.emplace_back(newTime, blockId);
    }
    auto res = std::min_element(timeBlocks.begin(),
                                timeBlocks.end(),
                                [](const auto& blk1, const auto& blk2) {
                                    return (blk1.first < blk2.first);
                                });
    return res->first;
}